

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void print_range_(Integer *me,Integer *LO,Integer *HI,Integer *ndim)

{
  undefined8 *in_RCX;
  Integer *in_RDX;
  Integer *in_RSI;
  ulong *in_RDI;
  char msg [100];
  int lo [7];
  int hi [7];
  char acStackY_d8 [8];
  char *in_stack_ffffffffffffff30;
  int *in_stack_ffffffffffffff38;
  int *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff4c;
  char *in_stack_ffffffffffffff50;
  int local_68 [8];
  int local_48 [10];
  undefined8 *local_20;
  Integer *local_18;
  Integer *local_10;
  
  if ((int)*in_RCX < 8) {
    local_20 = in_RCX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    sprintf(acStackY_d8,"%d: array section ",*in_RDI & 0xffffffff);
    f2c_copy_indices(local_18,local_48,(int)*local_20);
    f2c_copy_indices(local_10,local_68,(int)*local_20);
    print_range_internal
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    return;
  }
  __assert_fail("(int)*ndim <= GA_MAX_DIM",
                "/workspace/llm4binary/github/license_c_cmakelists/GlobalArrays[P]ga/global/testing/util.c"
                ,0x16d,"void print_range_(Integer *, Integer *, Integer *, Integer *)");
}

Assistant:

void FATR print_range_(Integer *me, Integer LO[], Integer HI[], Integer *ndim)
{
int hi[GA_MAX_DIM], lo[GA_MAX_DIM];
char msg[100];

    /* GA_MAX_DIM is defined for C and Fortran. Fortran routines should use <=
     * whereas C routines should use < for comparisons. */
    assert((int)*ndim <= GA_MAX_DIM);
    sprintf(msg,"%d: array section ",(int)*me);
    f2c_copy_indices(HI, hi, (int)*ndim);
    f2c_copy_indices(LO, lo, (int)*ndim);
    print_range_internal(msg,(int)*ndim, lo, hi, "\n");
}